

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

bool chain::str::equal<(chain::str::case_t)1>(string_view left,string_view right)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  undefined1 local_30 [8];
  string_view right_local;
  string_view left_local;
  
  right_local._M_len = (size_t)right._M_str;
  local_30 = (undefined1  [8])right._M_len;
  right_local._M_str = (char *)left._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (sVar1 == sVar2) {
    __first1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str);
    __last1 = std::basic_string_view<char,_std::char_traits<char>_>::end
                        ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str);
    __first2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    __last2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    left_local._M_str._7_1_ =
         std::equal<char_const*,char_const*,bool(*)(unsigned_char,unsigned_char)>
                   (__first1,__last1,__first2,__last2,equal_uchar<(chain::str::case_t)1>);
  }
  else {
    left_local._M_str._7_1_ = false;
  }
  return left_local._M_str._7_1_;
}

Assistant:

auto equal(std::string_view left, std::string_view right) -> bool
{
    if (left.length() == right.length())
    {
        if constexpr (case_type == case_t::sensitive)
        {
            return left == right;
        }
        else
        {
            return std::equal(left.begin(), left.end(), right.begin(), right.end(), equal_uchar<case_t::insensitive>);
        }
    }

    return false;
}